

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv4Transmitter::LeaveMulticastGroup(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  uint uVar1;
  HashElement *pHVar2;
  HashElement *pHVar3;
  RTPMemoryManager *pRVar4;
  HashElement *pHVar5;
  int iVar6;
  uint uVar7;
  ip_mreq mreq;
  uint local_28;
  uint local_24;
  
  iVar6 = -0x5a;
  if (((this->init == true) && (iVar6 = -0x59, this->created == true)) &&
     (iVar6 = -0x54, addr->addresstype == IPv4Address)) {
    uVar1 = *(uint *)&addr->field_0xc;
    iVar6 = -0x58;
    if ((uVar1 & 0xf0000000) == 0xe0000000) {
      pHVar5 = (this->multicastgroups).table[uVar1 % 0x207d];
      (this->multicastgroups).curhashelem = pHVar5;
      iVar6 = -5;
      while (pHVar5 != (HashElement *)0x0) {
        if (pHVar5->element == uVar1) {
          pHVar2 = pHVar5->hashprev;
          pHVar3 = pHVar5->hashnext;
          if (pHVar2 == (HashElement *)0x0) {
            (this->multicastgroups).table[pHVar5->hashindex] = pHVar3;
          }
          else {
            pHVar2->hashnext = pHVar3;
          }
          if (pHVar3 != (HashElement *)0x0) {
            pHVar3->hashprev = pHVar2;
          }
          pHVar5 = (this->multicastgroups).curhashelem;
          pHVar2 = pHVar5->listprev;
          pHVar3 = pHVar5->listnext;
          if (pHVar2 == (HashElement *)0x0) {
            (this->multicastgroups).firsthashelem = pHVar3;
            if (pHVar3 == (HashElement *)0x0) {
              (this->multicastgroups).lasthashelem = (HashElement *)0x0;
            }
            else {
              pHVar3->listprev = (HashElement *)0x0;
            }
          }
          else {
            pHVar2->listnext = pHVar3;
            if (pHVar3 == (HashElement *)0x0) {
              (this->multicastgroups).lasthashelem = pHVar2;
            }
            else {
              pHVar3->listprev = pHVar2;
            }
          }
          pRVar4 = (this->multicastgroups).super_RTPMemoryObject.mgr;
          if (pRVar4 == (RTPMemoryManager *)0x0) {
            operator_delete(pHVar5,0x28);
          }
          else {
            (**(code **)(*(long *)pRVar4 + 0x18))();
          }
          (this->multicastgroups).curhashelem = pHVar3;
          uVar7 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          uVar1 = this->mcastifaceIP;
          _local_28 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 << 0x18,uVar7);
          setsockopt(this->rtpsock,0,0x24,&local_28,8);
          if (this->rtpsock == this->rtcpsock) {
            return 0;
          }
          uVar1 = this->mcastifaceIP;
          _local_28 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 << 0x18,uVar7);
          setsockopt(this->rtcpsock,0,0x24,&local_28,8);
          return 0;
        }
        pHVar5 = pHVar5->hashnext;
        (this->multicastgroups).curhashelem = pHVar5;
      }
    }
  }
  return iVar6;
}

Assistant:

int RTPUDPv4Transmitter::LeaveMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	uint32_t mcastIP = address.GetIP();
	
	if (!RTPUDPV4TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.DeleteElement(mcastIP);
	if (status >= 0)
	{	
		RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
		if (rtpsock != rtcpsock) // no need to leave multicast group twice when multiplexing
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_DROP_MEMBERSHIP,mcastIP,status);

		status = 0;
	}
	
	MAINMUTEX_UNLOCK
	return status;
}